

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O0

VertexBufferId __thiscall
CS248::GLResourceManager::createVertexBufferFromData(GLResourceManager *this,float *data,int num)

{
  int in_EDX;
  void *in_RSI;
  unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> buffer_bind;
  GLuint id;
  VertexBufferId vbid;
  undefined4 in_stack_ffffffffffffffd0;
  GLuint GVar1;
  GLuint in_stack_ffffffffffffffe0;
  
  (*__glewGenBuffers)(1,(GLuint *)&stack0xffffffffffffffe0);
  GVar1 = in_stack_ffffffffffffffe0;
  bindVertexBuffer((GLResourceManager *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                   (VertexBufferId)(GLuint)((ulong)in_RSI >> 0x20));
  (*__glewBufferData)(0x8892,(long)in_EDX << 2,in_RSI,0x88e4);
  std::unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_>::~unique_ptr
            ((unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> *)
             CONCAT44(GVar1,in_stack_ffffffffffffffd0));
  return (VertexBufferId)in_stack_ffffffffffffffe0;
}

Assistant:

VertexBufferId GLResourceManager::createVertexBufferFromData(const float* data, int num) {
  GLuint id;
  glGenBuffers(1, &id);
  VertexBufferId vbid{id};
  auto buffer_bind = bindVertexBuffer(vbid);
  glBufferData(GL_ARRAY_BUFFER, sizeof(float) * num, (const void*) data, GL_STATIC_DRAW);
  return vbid;
}